

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_77::BinaryReaderIR::SetBlockDeclaration
          (BinaryReaderIR *this,BlockDeclaration *decl,Type sig_type)

{
  pointer pTVar1;
  Index index;
  Type local_8c;
  Location local_88;
  Var local_60;
  
  local_8c.enum_ = sig_type.enum_;
  if (sig_type.enum_ < Any) {
    decl->has_func_type = false;
    pTVar1 = (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar1;
    }
    Type::GetInlineVector((TypeVector *)&local_88,&local_8c);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_move_assign
              (&(decl->sig).result_types,&local_88);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_88);
  }
  else {
    index = Type::GetIndex(&local_8c);
    local_88.field_1.field_0.line = 0;
    local_88.field_1._4_8_ = 0;
    local_88.filename.data_ = (char *)0x0;
    local_88.filename.size_._0_4_ = 0;
    local_88.filename.size_._4_4_ = 0;
    Var::Var(&local_60,index,&local_88);
    SetFuncDeclaration(this,decl,&local_60);
    Var::~Var(&local_60);
  }
  return;
}

Assistant:

void BinaryReaderIR::SetBlockDeclaration(BlockDeclaration* decl,
                                         Type sig_type) {
  if (sig_type.IsIndex()) {
    Index type_index = sig_type.GetIndex();
    SetFuncDeclaration(decl, Var(type_index));
  } else {
    decl->has_func_type = false;
    decl->sig.param_types.clear();
    decl->sig.result_types = sig_type.GetInlineVector();
  }
}